

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mau.cpp
# Opt level: O0

void IncrementLoggerRefs(void)

{
  Locker locker;
  OutputWorker *in_stack_00000030;
  Lock *in_stack_ffffffffffffffd8;
  Locker *in_stack_ffffffffffffffe0;
  
  mau::Locker::Locker(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (LoggerRefs == 0) {
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Start(in_stack_00000030);
  }
  LoggerRefs = LoggerRefs + 1;
  mau::Locker::~Locker((Locker *)0x11b551);
  return;
}

Assistant:

static void IncrementLoggerRefs()
{
    Locker locker(LoggerLock);

    if (LoggerRefs == 0)
        logger::Start();

    ++LoggerRefs;
}